

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O1

void osThread::Sleep(unsigned_long ms,char *file,int line)

{
  void *pvVar1;
  
  pvVar1 = pthread_getspecific(tlsKey);
  if (pvVar1 != (void *)0x0) {
    *(char **)((long)pvVar1 + 0x100) = file;
    *(int *)((long)pvVar1 + 0x108) = line;
    *(unsigned_long *)((long)pvVar1 + 0xd8) = ms * 1000;
    usleep((__useconds_t)(ms * 1000));
    *(undefined8 *)((long)pvVar1 + 0xd8) = 0;
    return;
  }
  usleep((int)ms * 1000);
  return;
}

Assistant:

void osThread::Sleep(unsigned long ms, const char* file, int line)
{
    osThread* thread = GetCurrent();

    if (thread != nullptr)
    {
        thread->Filename = file;
        thread->Linenumber = line;

        thread->USleepTime = ms * 1000;
#ifdef _WIN32
        SleepEx(ms, true);
#elif __linux__
        usleep(ms * 1000);
#endif
        thread->USleepTime = 0;
    }
    else
    {
#ifdef _WIN32
        SleepEx(ms, true);
#elif __linux__
        usleep(ms * 1000);
#endif
    }
}